

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

void __thiscall cmCTestBZR::LogParser::StartElement(LogParser *this,string *name,char **param_2)

{
  pointer pcVar1;
  char cVar2;
  int iVar3;
  undefined1 local_130 [8];
  char *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar1 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    memset((Revision *)local_130,0,0x100);
    local_130 = (undefined1  [8])&local_120;
    local_128 = (char *)0x0;
    local_120._M_allocated_capacity = local_120._M_allocated_capacity & 0xffffffffffffff00;
    local_110._M_p = (pointer)&local_100;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    std::__cxx11::string::operator=((string *)&this->Rev,(string *)local_130);
    std::__cxx11::string::operator=((string *)&(this->Rev).Date,(string *)&local_110);
    std::__cxx11::string::operator=((string *)&(this->Rev).Author,(string *)&local_f0);
    std::__cxx11::string::operator=((string *)&(this->Rev).EMail,(string *)&local_d0);
    std::__cxx11::string::operator=((string *)&(this->Rev).Committer,(string *)&local_b0);
    std::__cxx11::string::operator=((string *)&(this->Rev).CommitterEMail,(string *)&local_90);
    std::__cxx11::string::operator=((string *)&(this->Rev).CommitDate,(string *)&local_70);
    std::__cxx11::string::operator=((string *)&(this->Rev).Log,(string *)&local_50);
    cmCTestVC::Revision::~Revision((Revision *)local_130);
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::_M_erase_at_end
              (&this->Changes,
               (this->Changes).
               super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
               ._M_impl.super__Vector_impl_data._M_start);
    return;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 == 0)) ||
     (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 == 0)) {
    local_130[0] = 0x3f;
    local_120._M_allocated_capacity = 0;
    local_120._M_local_buf[8] = '\0';
    (this->CurChange).Action = '?';
    local_128 = local_120._M_local_buf + 8;
    std::__cxx11::string::operator=((string *)&(this->CurChange).Path,(string *)&local_128);
    if (local_128 != local_120._M_local_buf + 8) {
      operator_delete(local_128,CONCAT71(local_120._9_7_,local_120._M_local_buf[8]) + 1);
    }
    (this->CurChange).Action = 'M';
    return;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    local_130[0] = 0x3f;
    local_120._M_allocated_capacity = 0;
    local_120._M_local_buf[8] = '\0';
    (this->CurChange).Action = '?';
    local_128 = local_120._M_local_buf + 8;
    std::__cxx11::string::operator=((string *)&(this->CurChange).Path,(string *)&local_128);
    if (local_128 != local_120._M_local_buf + 8) {
      operator_delete(local_128,CONCAT71(local_120._9_7_,local_120._M_local_buf[8]) + 1);
    }
    cVar2 = 'A';
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)name);
      if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0)) {
        return;
      }
      local_130[0] = 0x3f;
      local_120._M_allocated_capacity = 0;
      local_120._M_local_buf[8] = '\0';
      (this->CurChange).Action = '?';
      local_128 = local_120._M_local_buf + 8;
      std::__cxx11::string::operator=((string *)&(this->CurChange).Path,(string *)&local_128);
      if (local_128 == local_120._M_local_buf + 8) {
        return;
      }
      goto LAB_002d1c29;
    }
    local_130[0] = 0x3f;
    local_120._M_allocated_capacity = 0;
    local_120._M_local_buf[8] = '\0';
    (this->CurChange).Action = '?';
    local_128 = local_120._M_local_buf + 8;
    std::__cxx11::string::operator=((string *)&(this->CurChange).Path,(string *)&local_128);
    if (local_128 != local_120._M_local_buf + 8) {
      operator_delete(local_128,CONCAT71(local_120._9_7_,local_120._M_local_buf[8]) + 1);
    }
    cVar2 = 'D';
  }
  local_130[0] = cVar2;
  local_120._M_allocated_capacity = 0;
  local_120._M_local_buf[8] = '\0';
  (this->CurChange).Action = cVar2;
  local_128 = local_120._M_local_buf + 8;
  std::__cxx11::string::operator=((string *)&(this->CurChange).Path,(string *)&local_128);
  if (local_128 == local_120._M_local_buf + 8) {
    return;
  }
LAB_002d1c29:
  operator_delete(local_128,CONCAT71(local_120._9_7_,local_120._M_local_buf[8]) + 1);
  return;
}

Assistant:

void StartElement(const std::string& name, const char** /*atts*/) override
  {
    this->CData.clear();
    if (name == "log") {
      this->Rev = Revision();
      this->Changes.clear();
    }
    // affected-files can contain blocks of
    // modified, unknown, renamed, kind-changed, removed, conflicts, added
    else if (name == "modified" || name == "renamed" ||
             name == "kind-changed") {
      this->CurChange = Change();
      this->CurChange.Action = 'M';
    } else if (name == "added") {
      this->CurChange = Change();
      this->CurChange = 'A';
    } else if (name == "removed") {
      this->CurChange = Change();
      this->CurChange = 'D';
    } else if (name == "unknown" || name == "conflicts") {
      // Should not happen here
      this->CurChange = Change();
    }
  }